

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_error_t adt_ary_unshift(adt_ary_t *self,void *pElem)

{
  void **ppvVar1;
  uint32_t u32Remain;
  uint32_t u32ElemSize;
  adt_error_t result;
  uint8_t *pEnd;
  uint8_t *pBegin;
  void *pElem_local;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else if (self->s32CurLen == 0x7fffffff) {
    self_local._7_1_ = '\x04';
  }
  else if (self->ppAlloc < self->pFirst) {
    ppvVar1 = self->pFirst;
    self->pFirst = ppvVar1 + -1;
    ppvVar1[-1] = pElem;
    self->s32CurLen = self->s32CurLen + 1;
    self_local._7_1_ = '\0';
  }
  else {
    self_local._7_1_ = adt_ary_extend(self,self->s32CurLen + 1);
    if (self_local._7_1_ == '\0') {
      adt_block_memmove((uint8_t *)(self->pFirst + 1),(uint8_t *)self->pFirst,
                        ((int)self->pFirst + self->s32CurLen * 8) - (int)(self->pFirst + 1));
      *self->pFirst = pElem;
    }
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t	adt_ary_unshift(adt_ary_t *self, void *pElem){
   if ( self != 0 ) {
      if (self->s32CurLen == INT32_MAX) {
         return ADT_LENGTH_ERROR; //cannot fit any more elements into the array
      }
      if(self->pFirst > self->ppAlloc){
         //room for one more element at the beginning
         *(--self->pFirst)=pElem;
         self->s32CurLen++;
         return ADT_NO_ERROR;
      }
      else {
         //no room at beginning of array, move all array data forward by one
         uint8_t *pBegin,*pEnd;
         adt_error_t result;
         uint32_t u32ElemSize = sizeof(void**);
         result = adt_ary_extend(self,(int32_t) (self->s32CurLen+1));
         if (result == ADT_NO_ERROR) {
            uint32_t u32Remain;
            pBegin = (uint8_t*) self->pFirst+u32ElemSize;
            pEnd = ((uint8_t*) &self->pFirst[self->s32CurLen]);
            u32Remain = (uint32_t) (pEnd-pBegin);
            adt_block_memmove(pBegin, (uint8_t*) self->pFirst, u32Remain);
            self->pFirst[0]=pElem;
         }
         return result;
      }
   }
	return ADT_INVALID_ARGUMENT_ERROR;
}